

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O1

void bloaty::pe::ParseSections(PeFile *pe,RangeSink *sink)

{
  ulong uVar1;
  ulong uVar2;
  ulong filesize;
  size_t n;
  string_view sVar3;
  Section local_78;
  
  if (pe->ok_ == false) {
    __assert_fail("pe.IsOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/pe.cc",0xc0
                  ,"void bloaty::pe::ParseSections(const PeFile &, RangeSink *)");
  }
  if (pe->section_count_ != 0) {
    n = 0;
    do {
      sVar3 = PeFile::section_header(pe,n);
      Section::Section(&local_78,sVar3);
      uVar1 = (pe->data_)._M_len;
      uVar2 = (ulong)local_78.header_.PointerToRawData;
      filesize = (ulong)local_78.header_.SizeOfRawData;
      if (uVar1 < filesize + uVar2) {
        Throw("region out-of-bounds",0x5d);
      }
      if (uVar1 < uVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar2);
      }
      if (uVar1 - uVar2 < filesize) {
        filesize = uVar1 - uVar2;
      }
      sVar3._M_str = local_78.name._M_dataplus._M_p;
      sVar3._M_len = local_78.name._M_string_length;
      RangeSink::AddRange(sink,"pe_sections",sVar3,(ulong)local_78.header_.VirtualAddress,
                          (ulong)local_78.header_.VirtualSize,
                          (uint64_t)
                          ((pe->data_)._M_str + (uVar2 - (long)(sink->file_->data_)._M_str)),
                          filesize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
        operator_delete(local_78.name._M_dataplus._M_p,
                        local_78.name.field_2._M_allocated_capacity + 1);
      }
      n = n + 1;
    } while (n < pe->section_count_);
  }
  return;
}

Assistant:

void ParseSections(const PeFile& pe, RangeSink* sink) {
  assert(pe.IsOpen());
  ForEachSection(pe, [sink, &pe](const Section& section) {
    uint64_t vmaddr = section.virtual_addr();
    uint64_t vmsize = section.virtual_size();
    std::string_view section_data = StrictSubstr(
        pe.entire_file(), section.raw_offset(), section.raw_size());

    sink->AddRange("pe_sections", section.name, vmaddr, vmsize, section_data);
  });
}